

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collationsets.cpp
# Opt level: O2

void __thiscall
icu_63::ContractionsAndExpansions::handleCE32
          (ContractionsAndExpansions *this,UChar32 start,UChar32 end,uint32_t ce32)

{
  CollationData *d;
  int32_t iVar1;
  int64_t iVar2;
  _func_int **pp_Var3;
  UChar32 c;
  ulong uVar4;
  CESink *pCVar5;
  uint32_t *puVar6;
  ulong uVar7;
  int64_t *piVar8;
  UChar local_1d6;
  UChar32 local_1d4;
  UTF16CollationIterator iter;
  
  d = this->data;
LAB_0023e2ab:
  if ((~ce32 & 0xc0) != 0) {
    pCVar5 = this->sink;
    if (pCVar5 == (CESink *)0x0) {
      return;
    }
    iVar2 = Collation::ceFromSimpleCE32(ce32);
    (*pCVar5->_vptr_CESink[2])(pCVar5,iVar2);
    return;
  }
  switch(ce32 & 0xf) {
  default:
    goto switchD_0023e2c2_caseD_0;
  case 1:
    pCVar5 = this->sink;
    if (pCVar5 == (CESink *)0x0) {
      return;
    }
    uVar4 = (ulong)(ce32 & 0xffffff00) << 0x20 | 0x5000500;
    goto LAB_0023e49a;
  case 2:
    pCVar5 = this->sink;
    if (pCVar5 == (CESink *)0x0) {
      return;
    }
    uVar4 = (ulong)(ce32 & 0xffffff00);
LAB_0023e49a:
    (*pCVar5->_vptr_CESink[2])(pCVar5,uVar4);
    return;
  case 3:
  case 7:
  case 0xd:
    if (U_ZERO_ERROR < this->errorCode) {
      return;
    }
    this->errorCode = U_INTERNAL_PROGRAM_ERROR;
    return;
  case 4:
    pCVar5 = this->sink;
    if (pCVar5 == (CESink *)0x0) goto LAB_0023e526;
    piVar8 = this->ces;
    this->ces[0] = (CONCAT44(ce32,ce32 >> 8) & 0xff0000000000ff00) + 0x5000000;
    this->ces[1] = (ulong)((ce32 & 0xff00) << 0x10 | 0x500);
    pp_Var3 = pCVar5->_vptr_CESink;
    uVar4 = 2;
    break;
  case 5:
    if (this->sink != (CESink *)0x0) {
      puVar6 = d->ce32s;
      uVar7 = (ulong)(ce32 >> 8 & 0x1f);
      local_1d4 = start;
      for (uVar4 = 0; uVar7 != uVar4; uVar4 = uVar4 + 1) {
        iVar2 = Collation::ceFromCE32
                          (*(uint32_t *)
                            ((long)puVar6 + uVar4 * 4 + (ulong)(ce32 >> 0xb & 0xfffffffc)));
        this->ces[uVar4] = iVar2;
      }
      (*this->sink->_vptr_CESink[3])(this->sink,this->ces,uVar7);
      start = local_1d4;
    }
    goto LAB_0023e526;
  case 6:
    pCVar5 = this->sink;
    if (pCVar5 == (CESink *)0x0) goto LAB_0023e526;
    uVar4 = (ulong)(ce32 >> 8 & 0x1f);
    piVar8 = (int64_t *)((ulong)(ce32 >> 10 & 0xfffffff8) + (long)d->ces);
    pp_Var3 = pCVar5->_vptr_CESink;
    break;
  case 8:
    handlePrefixes(this,start,end,ce32);
    return;
  case 9:
    handleContractions(this,start,end,ce32);
    return;
  case 10:
    puVar6 = (uint32_t *)((ulong)(ce32 >> 0xb & 0xfffffffc) + (long)d->ce32s);
    goto LAB_0023e2d6;
  case 0xb:
    puVar6 = d->ce32s;
LAB_0023e2d6:
    ce32 = *puVar6;
    goto LAB_0023e2ab;
  case 0xc:
    if (this->sink != (CESink *)0x0) {
      UTF16CollationIterator::UTF16CollationIterator
                (&iter,d,'\0',(UChar *)0x0,(UChar *)0x0,(UChar *)0x0);
      local_1d4 = start;
      for (; start <= end; start = start + 1) {
        local_1d6 = (UChar)start;
        UTF16CollationIterator::setText(&iter,&local_1d6,(UChar *)&local_1d4);
        iVar1 = CollationIterator::fetchCEs(&iter.super_CollationIterator,&this->errorCode);
        if (U_ZERO_ERROR < this->errorCode) {
          UTF16CollationIterator::~UTF16CollationIterator(&iter);
          return;
        }
        (*this->sink->_vptr_CESink[3])
                  (this->sink,iter.super_CollationIterator.ceBuffer.buffer.ptr,(ulong)(iVar1 - 1));
      }
      UTF16CollationIterator::~UTF16CollationIterator(&iter);
      start = local_1d4;
    }
    if (0x1f < (ushort)(this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags) {
      return;
    }
    addExpansions(this,start,end);
    return;
  }
  (*pp_Var3[3])(pCVar5,piVar8,uVar4);
LAB_0023e526:
  if ((ushort)(this->unreversedPrefix).fUnion.fStackFields.fLengthAndFlags < 0x20) {
    addExpansions(this,start,end);
    return;
  }
switchD_0023e2c2_caseD_0:
  return;
}

Assistant:

void
ContractionsAndExpansions::handleCE32(UChar32 start, UChar32 end, uint32_t ce32) {
    for(;;) {
        if((ce32 & 0xff) < Collation::SPECIAL_CE32_LOW_BYTE) {
            // !isSpecialCE32()
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromSimpleCE32(ce32));
            }
            return;
        }
        switch(Collation::tagFromCE32(ce32)) {
        case Collation::FALLBACK_TAG:
            return;
        case Collation::RESERVED_TAG_3:
        case Collation::BUILDER_DATA_TAG:
        case Collation::LEAD_SURROGATE_TAG:
            if(U_SUCCESS(errorCode)) { errorCode = U_INTERNAL_PROGRAM_ERROR; }
            return;
        case Collation::LONG_PRIMARY_TAG:
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromLongPrimaryCE32(ce32));
            }
            return;
        case Collation::LONG_SECONDARY_TAG:
            if(sink != NULL) {
                sink->handleCE(Collation::ceFromLongSecondaryCE32(ce32));
            }
            return;
        case Collation::LATIN_EXPANSION_TAG:
            if(sink != NULL) {
                ces[0] = Collation::latinCE0FromCE32(ce32);
                ces[1] = Collation::latinCE1FromCE32(ce32);
                sink->handleExpansion(ces, 2);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::EXPANSION32_TAG:
            if(sink != NULL) {
                const uint32_t *ce32s = data->ce32s + Collation::indexFromCE32(ce32);
                int32_t length = Collation::lengthFromCE32(ce32);
                for(int32_t i = 0; i < length; ++i) {
                    ces[i] = Collation::ceFromCE32(*ce32s++);
                }
                sink->handleExpansion(ces, length);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::EXPANSION_TAG:
            if(sink != NULL) {
                int32_t length = Collation::lengthFromCE32(ce32);
                sink->handleExpansion(data->ces + Collation::indexFromCE32(ce32), length);
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::PREFIX_TAG:
            handlePrefixes(start, end, ce32);
            return;
        case Collation::CONTRACTION_TAG:
            handleContractions(start, end, ce32);
            return;
        case Collation::DIGIT_TAG:
            // Fetch the non-numeric-collation CE32 and continue.
            ce32 = data->ce32s[Collation::indexFromCE32(ce32)];
            break;
        case Collation::U0000_TAG:
            U_ASSERT(start == 0 && end == 0);
            // Fetch the normal ce32 for U+0000 and continue.
            ce32 = data->ce32s[0];
            break;
        case Collation::HANGUL_TAG:
            if(sink != NULL) {
                // TODO: This should be optimized,
                // especially if [start..end] is the complete Hangul range. (assert that)
                UTF16CollationIterator iter(data, FALSE, NULL, NULL, NULL);
                UChar hangul[1] = { 0 };
                for(UChar32 c = start; c <= end; ++c) {
                    hangul[0] = (UChar)c;
                    iter.setText(hangul, hangul + 1);
                    int32_t length = iter.fetchCEs(errorCode);
                    if(U_FAILURE(errorCode)) { return; }
                    // Ignore the terminating non-CE.
                    U_ASSERT(length >= 2 && iter.getCE(length - 1) == Collation::NO_CE);
                    sink->handleExpansion(iter.getCEs(), length - 1);
                }
            }
            // Optimization: If we have a prefix,
            // then the relevant strings have been added already.
            if(unreversedPrefix.isEmpty()) {
                addExpansions(start, end);
            }
            return;
        case Collation::OFFSET_TAG:
            // Currently no need to send offset CEs to the sink.
            return;
        case Collation::IMPLICIT_TAG:
            // Currently no need to send implicit CEs to the sink.
            return;
        }
    }
}